

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  char *pcVar1;
  
  std::operator<<(stream,"<![CDATA[");
  while( true ) {
    pcVar1 = strstr(data,"]]>");
    if (pcVar1 == (char *)0x0) break;
    std::ostream::write((char *)stream,(long)data);
    std::operator<<(stream,"]]>]]&gt;<![CDATA[");
    data = pcVar1 + 3;
  }
  std::operator<<(stream,data);
  std::operator<<(stream,"]]>");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != NULL) {
      stream->write(
          segment, static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}